

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_string
          (xml_buffered_writer *this,char_t *data)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  char_t cVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  uVar1 = this->bufsize;
  cVar5 = *data;
  bVar8 = uVar1 < 0x800;
  uVar3 = uVar1;
  if (cVar5 != '\0' && bVar8) {
    do {
      uVar1 = uVar3 + 1;
      this->buffer[uVar3] = cVar5;
      cVar5 = data[1];
      data = data + 1;
      bVar8 = uVar3 < 0x7ff;
      if (cVar5 == '\0') break;
      bVar9 = uVar3 < 0x7ff;
      uVar3 = uVar1;
    } while (bVar9);
  }
  if (bVar8) {
    this->bufsize = uVar1;
    return;
  }
  uVar6 = uVar1 - this->bufsize;
  if (uVar6 < 5) {
    uVar4 = 0;
  }
  else {
    uVar4 = uVar6 - 1;
    if ((data[-1] & 0xc0) == 0x80) {
      uVar4 = uVar3;
    }
  }
  lVar7 = uVar6 - uVar4;
  this->bufsize = uVar1 - lVar7;
  sVar2 = strlen((char *)data);
  write_direct(this,data + -lVar7,lVar7 + sVar2);
  return;
}

Assistant:

void write_string(const char_t* data)
		{
			// write the part of the string that fits in the buffer
			size_t offset = bufsize;

			while (*data && offset < bufcapacity)
				buffer[offset++] = *data++;

			// write the rest
			if (offset < bufcapacity)
			{
				bufsize = offset;
			}
			else
			{
				// backtrack a bit if we have split the codepoint
				size_t length = offset - bufsize;
				size_t extra = length - get_valid_length(data - length, length);

				bufsize = offset - extra;

				write_direct(data - extra, strlength(data) + extra);
			}
		}